

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<long>::Resize(RepeatedField<long> *this,int new_size,long *value)

{
  long lVar1;
  LogMessage *other;
  long *plVar2;
  long *plVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x275);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    plVar2 = elements(this);
    plVar2 = plVar2 + this->current_size_;
    plVar3 = elements(this);
    if (plVar2 != plVar3 + new_size) {
      lVar1 = *value;
      do {
        *plVar2 = lVar1;
        plVar2 = plVar2 + 1;
      } while (plVar2 != plVar3 + new_size);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}